

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRProjectionNode::render
          (VRProjectionNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  VRDataIndex *in_RSI;
  VRMatrix4 viewMat;
  VRMatrix4 cameraMat;
  VRDataIndex *in_stack_fffffffffffffc20;
  VRRenderHandler *renderHandler_00;
  VRAnyCoreType t;
  allocator<char> *in_stack_fffffffffffffc40;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc48;
  VRDataIndex *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  VRFloatArrayConvertible *in_stack_fffffffffffffc58;
  VRFloat value;
  VRDataIndex *object;
  string *in_stack_fffffffffffffc60;
  string *key;
  VRDataIndex *in_stack_fffffffffffffc68;
  VRDataIndex *this_01;
  allocator<char> local_349;
  string local_348 [16];
  VRMatrix4 *in_stack_fffffffffffffcc8;
  string local_328 [32];
  VRMatrix4 local_308;
  undefined8 local_2b9;
  undefined1 local_291 [41];
  VRMatrix4 local_268;
  allocator<char> local_219;
  string local_218 [32];
  string local_1f8 [39];
  undefined1 local_1d1 [33];
  string local_1b0 [23];
  undefined1 in_stack_fffffffffffffe67;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  VRDataIndex *in_stack_fffffffffffffe78;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [40];
  VRDataIndex *local_10;
  
  local_10 = in_RSI;
  VRDataIndex::pushState(in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  VRDataIndex::addData
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  value = (VRFloat)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  VRDataIndex::addData(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,value);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  VRDataIndex::addData(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,value);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  this_01 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  VRDataIndex::addData(this_01,in_stack_fffffffffffffc60,value);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  key = (string *)&stack0xfffffffffffffe77;
  object = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  VRDataIndex::addData(this_01,key,(VRFloat)((ulong)object >> 0x20));
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d1;
  __s = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffc40);
  VRDataIndex::addData(this_01,key,(VRFloat)((ulong)object >> 0x20));
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  __a = &local_219;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  VRDataIndex::addData(this_01,key,(VRFloat)((ulong)object >> 0x20));
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  t.datum = (VRDatum_conflict *)local_291;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  renderHandler_00 = (VRRenderHandler *)&local_2b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_291._33_8_ =
       VRDataIndex::getValue
                 (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                  (bool)in_stack_fffffffffffffe67);
  VRMatrix4::VRMatrix4((VRMatrix4 *)local_10,t);
  std::__cxx11::string::~string((string *)((long)&local_2b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)(local_291 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_291);
  VRMatrix4::inverse(in_stack_fffffffffffffcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  VRDataIndex::addData(this_01,key,(VRFloatArrayConvertible *)object);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  VRDisplayNode::render((VRDisplayNode *)t.datum,local_10,renderHandler_00);
  VRDataIndex::popState((VRDataIndex *)t.datum);
  VRMatrix4::~VRMatrix4(&local_308);
  VRMatrix4::~VRMatrix4(&local_268);
  return;
}

Assistant:

void VRProjectionNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
  renderState->pushState();

  renderState->addData("ProjectionMatrix", _projectionMatrix);
  renderState->addData("ProjectionHorizontalClip", _horizontalClip);
  renderState->addData("ProjectoinVerticalClip", _verticalClip);
  renderState->addData("ProjectionFovX", _fovX);
  renderState->addData("ProjectionFovY", _fovY);
  renderState->addData("ProjectionNearClip", _nearClip);
  renderState->addData("ProjectionFarClip", _farClip);

  VRMatrix4 cameraMat = renderState->getValue("CameraMatrix");

  VRMatrix4 viewMat = cameraMat.inverse();

  renderState->addData("ViewMatrix", viewMat);

  VRDisplayNode::render(renderState, renderHandler);

  renderState->popState();

}